

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cBufferStorageTests.cpp
# Opt level: O1

void __thiscall
gl4cts::BufferStorage::GetBufferParameterTest::GetBufferParameterTest
          (GetBufferParameterTest *this,Context *context)

{
  vector<gl4cts::BufferStorage::GetBufferParameterTest::testCase,_std::allocator<gl4cts::BufferStorage::GetBufferParameterTest::testCase>_>
  *this_00;
  uint uVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  testCase local_78;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  long local_60;
  GetBufferParameterTest *local_58;
  ulong local_50;
  ulong local_48;
  long local_40;
  long local_38;
  
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,"get_buffer_parameter",
             "Test queries for parameters of buffers");
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GetBufferParameterTest_021091f8;
  this_00 = &this->m_test_cases;
  (this->m_test_cases).
  super__Vector_base<gl4cts::BufferStorage::GetBufferParameterTest::testCase,_std::allocator<gl4cts::BufferStorage::GetBufferParameterTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::BufferStorage::GetBufferParameterTest::testCase,_std::allocator<gl4cts::BufferStorage::GetBufferParameterTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::BufferStorage::GetBufferParameterTest::testCase,_std::allocator<gl4cts::BufferStorage::GetBufferParameterTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = 0;
  local_58 = this;
  do {
    local_70 = (uint)((int)local_50 != 0) << 8;
    uVar5 = 0;
    do {
      local_78.m_flags = (uint)((int)uVar5 != 0) << 9 | local_70;
      local_70 = local_78.m_flags;
      if (local_78.m_flags != 0) {
        local_78.m_access = 0;
        std::
        vector<gl4cts::BufferStorage::GetBufferParameterTest::testCase,_std::allocator<gl4cts::BufferStorage::GetBufferParameterTest::testCase>_>
        ::emplace_back<gl4cts::BufferStorage::GetBufferParameterTest::testCase>(this_00,&local_78);
      }
      local_60 = 4;
      lVar4 = 0;
      local_48 = uVar5;
      do {
        local_6c = GetBufferParameterTest::s_mapping_bits[lVar4] | local_70;
        local_64 = local_6c | 1;
        local_68 = local_6c | 2;
        local_6c = local_6c | 3;
        lVar6 = 0;
        local_40 = lVar4;
        do {
          uVar1 = *(uint *)((long)GetBufferParameterTest::s_mapping_bits + lVar6);
          local_78.m_flags = local_64;
          local_78.m_access = uVar1 | 1;
          std::
          vector<gl4cts::BufferStorage::GetBufferParameterTest::testCase,_std::allocator<gl4cts::BufferStorage::GetBufferParameterTest::testCase>_>
          ::emplace_back<gl4cts::BufferStorage::GetBufferParameterTest::testCase>(this_00,&local_78)
          ;
          local_78.m_flags = local_68;
          local_78.m_access = uVar1 | 2;
          local_38 = lVar6;
          std::
          vector<gl4cts::BufferStorage::GetBufferParameterTest::testCase,_std::allocator<gl4cts::BufferStorage::GetBufferParameterTest::testCase>_>
          ::emplace_back<gl4cts::BufferStorage::GetBufferParameterTest::testCase>(this_00,&local_78)
          ;
          uVar3 = local_6c;
          local_78.m_flags = local_6c;
          local_78.m_access = uVar1 | 1;
          std::
          vector<gl4cts::BufferStorage::GetBufferParameterTest::testCase,_std::allocator<gl4cts::BufferStorage::GetBufferParameterTest::testCase>_>
          ::emplace_back<gl4cts::BufferStorage::GetBufferParameterTest::testCase>(this_00,&local_78)
          ;
          local_78.m_flags = uVar3;
          local_78.m_access = uVar1 | 2;
          std::
          vector<gl4cts::BufferStorage::GetBufferParameterTest::testCase,_std::allocator<gl4cts::BufferStorage::GetBufferParameterTest::testCase>_>
          ::emplace_back<gl4cts::BufferStorage::GetBufferParameterTest::testCase>(this_00,&local_78)
          ;
          local_78.m_access = uVar1 | 3;
          local_78.m_flags = uVar3;
          std::
          vector<gl4cts::BufferStorage::GetBufferParameterTest::testCase,_std::allocator<gl4cts::BufferStorage::GetBufferParameterTest::testCase>_>
          ::emplace_back<gl4cts::BufferStorage::GetBufferParameterTest::testCase>(this_00,&local_78)
          ;
          lVar6 = local_38 + 4;
        } while (local_60 != lVar6);
        lVar4 = local_40 + 1;
        local_60 = local_60 + 4;
      } while (lVar4 != 3);
      uVar5 = (ulong)((int)local_48 + 1);
    } while ((int)local_48 == 0);
    iVar2 = (int)local_50;
    local_50 = (ulong)(iVar2 + 1);
  } while (iVar2 == 0);
  return;
}

Assistant:

GetBufferParameterTest::GetBufferParameterTest(deqp::Context& context)
	: TestCase(context, "get_buffer_parameter", "Test queries for parameters of buffers")
{
	static const GLenum s_mapping_bits[] = { 0, GL_MAP_PERSISTENT_BIT, GL_MAP_COHERENT_BIT | GL_MAP_PERSISTENT_BIT };
	static const GLuint s_n_mapping_bits = sizeof(s_mapping_bits) / sizeof(s_mapping_bits[0]);

	GLenum flags = 0;

	for (GLuint dynamic = 0; dynamic < 2; ++dynamic)
	{
		flags = (0 == dynamic) ? 0 : GL_DYNAMIC_STORAGE_BIT;

		for (GLuint client = 0; client < 2; ++client)
		{
			flags |= (0 == client) ? 0 : GL_CLIENT_STORAGE_BIT;

			/* No "map" bits */
			if (0 != flags)
			{
				m_test_cases.push_back(testCase(flags, 0));
			}

			for (GLuint flag_idx = 0; flag_idx < s_n_mapping_bits; ++flag_idx)
			{
				const GLenum flag_mapping_bits  = s_mapping_bits[flag_idx];
				const GLenum flags_with_mapping = flags | flag_mapping_bits;

				for (GLuint access_idx = 0; access_idx <= flag_idx; ++access_idx)
				{
					const GLenum access = s_mapping_bits[access_idx];

					m_test_cases.push_back(testCase(flags_with_mapping | GL_MAP_READ_BIT, access | GL_MAP_READ_BIT));
					m_test_cases.push_back(testCase(flags_with_mapping | GL_MAP_WRITE_BIT, access | GL_MAP_WRITE_BIT));
					m_test_cases.push_back(
						testCase(flags_with_mapping | GL_MAP_READ_BIT | GL_MAP_WRITE_BIT, access | GL_MAP_READ_BIT));
					m_test_cases.push_back(
						testCase(flags_with_mapping | GL_MAP_READ_BIT | GL_MAP_WRITE_BIT, access | GL_MAP_WRITE_BIT));
					m_test_cases.push_back(testCase(flags_with_mapping | GL_MAP_READ_BIT | GL_MAP_WRITE_BIT,
													access | GL_MAP_WRITE_BIT | GL_MAP_READ_BIT));
				}
			}
		}
	}
}